

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O0

void __thiscall xLearn::DMatrix::~DMatrix(DMatrix *this)

{
  vector<float,_std::allocator<float>_> *unaff_retaddr;
  
  std::vector<float,_std::allocator<float>_>::~vector(unaff_retaddr);
  std::vector<float,_std::allocator<float>_>::~vector(unaff_retaddr);
  std::
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ::~vector((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
             *)unaff_retaddr);
  return;
}

Assistant:

~DMatrix() { }